

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_obj.cpp
# Opt level: O2

tri * load_obj(char *file_name,size_t *tri_count)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  size_t sVar6;
  tri *ptVar7;
  long lVar8;
  bool bVar9;
  allocator<char> local_51;
  vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> tri_vec;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,file_name,&local_51);
  obj::load_from_file<float>(&tri_vec,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sVar6 = ((long)tri_vec.
                 super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)tri_vec.
                super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x24;
  *tri_count = sVar6;
  if ((long)tri_vec.
            super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)tri_vec.
            super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
    ptVar7 = (tri *)0x0;
  }
  else {
    ptVar7 = (tri *)malloc((long)tri_vec.
                                 super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)tri_vec.
                                 super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
    lVar8 = 0x20;
    while (bVar9 = sVar6 != 0, sVar6 = sVar6 - 1, bVar9) {
      puVar1 = (undefined8 *)
               ((long)((tri_vec.
                        super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->p0).values + lVar8 + -0x20);
      uVar3 = puVar1[1];
      uVar4 = puVar1[2];
      uVar5 = puVar1[3];
      puVar2 = (undefined8 *)((long)ptVar7->v + lVar8 + -0x20);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      puVar2[2] = uVar4;
      puVar2[3] = uVar5;
      *(undefined4 *)((long)&ptVar7->v[0].x + lVar8) =
           *(undefined4 *)
            ((long)((tri_vec.
                     super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->p0).values + lVar8);
      lVar8 = lVar8 + 0x24;
    }
  }
  std::_Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>::
  ~_Vector_base(&tri_vec.
                 super__Vector_base<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_>
               );
  return ptVar7;
}

Assistant:

tri* load_obj(const char* file_name, size_t* tri_count) {
    auto tri_vec = load_obj<float>(file_name);
    *tri_count = tri_vec.size();
    if (tri_vec.size() == 0)
        return NULL;
    tri* tris = reinterpret_cast<tri*>(malloc(sizeof(tri) * tri_vec.size()));
    for (size_t i = 0; i < tri_vec.size(); ++i) {
        tris[i].v[0].x = tri_vec[i].p0[0];
        tris[i].v[0].y = tri_vec[i].p0[1];
        tris[i].v[0].z = tri_vec[i].p0[2];
        tris[i].v[1].x = tri_vec[i].p1[0];
        tris[i].v[1].y = tri_vec[i].p1[1];
        tris[i].v[1].z = tri_vec[i].p1[2];
        tris[i].v[2].x = tri_vec[i].p2[0];
        tris[i].v[2].y = tri_vec[i].p2[1];
        tris[i].v[2].z = tri_vec[i].p2[2];
    }
    return tris;
}